

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O2

int __thiscall Hes_Emu::cpu_done(Hes_Emu *this)

{
  state_t *psVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  if (((this->super_Hes_Cpu).r.status & 4) == 0) {
    psVar1 = (this->super_Hes_Cpu).state;
    iVar3 = psVar1->base + psVar1->time;
    if (((this->irq).timer <= iVar3) && (((this->irq).disables & 4) == 0)) {
      (this->timer).fired = '\x01';
      (this->irq).timer = 0x40000000;
      irq_changed(this);
      return 10;
    }
    if ((this->irq).vdp <= iVar3) {
      iVar2 = (~*(uint *)&(this->irq).disables & 2) << 2;
    }
  }
  return iVar2;
}

Assistant:

int Hes_Emu::cpu_done()
{
	check( time() >= end_time() ||
			(!(r.status & i_flag_mask) && time() >= irq_time()) );
	
	if ( !(r.status & i_flag_mask) )
	{
		hes_time_t present = time();
		
		if ( irq.timer <= present && !(irq.disables & timer_mask) )
		{
			timer.fired = true;
			irq.timer = future_hes_time;
			irq_changed(); // overkill, but not worth writing custom code
			#if GME_FRAME_HOOK_DEFINED
			{
				unsigned const threshold = period_60hz / 30;
				unsigned long elapsed = present - last_frame_hook;
				if ( elapsed - period_60hz + threshold / 2 < threshold )
				{
					last_frame_hook = present;
					GME_FRAME_HOOK( this );
				}
			}
			#endif
			return 0x0A;
		}
		
		if ( irq.vdp <= present && !(irq.disables & vdp_mask) )
		{
			// work around for bugs with music not acknowledging VDP
			//run_until( present );
			//irq.vdp = future_hes_time;
			//irq_changed();
			#if GME_FRAME_HOOK_DEFINED
				last_frame_hook = present;
				GME_FRAME_HOOK( this );
			#endif
			return 0x08;
		}
	}
	return 0;
}